

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedFloatType<double>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedFloatType<double> min,WrappedFloatType<double> max,float gridSize)

{
  double __x;
  int iVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  double __y;
  WrappedFloatType<double> WVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  deRandom rnd;
  int local_e0;
  int local_dc;
  deRandom local_40;
  
  iVar6 = componentCount * 8;
  if (stride != 0) {
    iVar6 = stride;
  }
  iVar4 = iVar6 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar4 = 0;
  }
  pcVar2 = (char *)operator_new__((long)(iVar4 * count + offset));
  deRandom_init(&local_40,seed);
  if ((primitive == PRIMITIVE_TRIANGLES) && (0 < count)) {
    fVar18 = (float)max.m_value - (float)min.m_value;
    uVar7 = -(uint)(-fVar18 <= fVar18);
    fVar17 = (float)(~uVar7 & (uint)-fVar18 | uVar7 & (uint)fVar18) * gridSize;
    fVar19 = 4.0;
    if (4.0 <= fVar17) {
      fVar19 = fVar17;
    }
    __y = (double)fVar19;
    local_dc = 0x10;
    local_e0 = 0x18;
    uVar5 = 0;
    do {
      uVar7 = 0;
      while( true ) {
        WVar9.m_value = min.m_value;
        if (min.m_value <= max.m_value) {
          fVar17 = deRandom_getFloat(&local_40);
          WVar9.m_value = (double)(fVar17 * fVar18) + min.m_value;
        }
        dVar10 = fmod(WVar9.m_value,__y);
        dVar10 = WVar9.m_value - dVar10;
        dVar11 = __y;
        if (fVar19 <= ABS((float)(max.m_value - dVar10))) {
          fVar17 = deRandom_getFloat(&local_40);
          dVar11 = (double)((ABS((float)(max.m_value - dVar10)) - fVar19) * fVar17) + __y;
        }
        dVar12 = fmod(dVar11,__y);
        WVar9.m_value = min.m_value;
        if (min.m_value <= max.m_value) {
          fVar17 = deRandom_getFloat(&local_40);
          WVar9.m_value = (double)(fVar17 * fVar18) + min.m_value;
        }
        dVar13 = fmod(WVar9.m_value,__y);
        dVar13 = WVar9.m_value - dVar13;
        __x = __y;
        if (fVar19 <= ABS((float)(max.m_value - dVar13))) {
          fVar17 = deRandom_getFloat(&local_40);
          __x = (double)((ABS((float)(max.m_value - dVar13)) - fVar19) * fVar17) + __y;
        }
        dVar14 = fmod(__x,__y);
        if (componentCount < 3) break;
        if (min.m_value <= max.m_value) {
          fVar17 = deRandom_getFloat(&local_40);
          dVar15 = (double)(fVar17 * fVar18) + min.m_value;
          dVar16 = fmod(dVar15,__y);
          dVar15 = dVar15 - dVar16;
          if (componentCount != 3) {
            fVar17 = deRandom_getFloat(&local_40);
            WVar9.m_value = (double)(fVar17 * fVar18) + min.m_value;
            goto LAB_0185fa81;
          }
          dVar16 = 1.0;
        }
        else {
          dVar15 = fmod(min.m_value,__y);
          dVar15 = min.m_value - dVar15;
          dVar16 = 1.0;
          WVar9.m_value = min.m_value;
          if (componentCount != 3) {
LAB_0185fa81:
            dVar16 = fmod(WVar9.m_value,__y);
            dVar16 = WVar9.m_value - dVar16;
          }
        }
        fVar17 = (float)dVar15 + (float)(dVar11 - dVar12);
        uVar8 = -(uint)(-fVar17 <= fVar17);
        if (((fVar19 <= (float)(~uVar8 & (uint)-fVar17 | (uint)fVar17 & uVar8)) &&
            (fVar17 = (float)dVar16 + (float)(__x - dVar14), uVar8 = -(uint)(-fVar17 <= fVar17),
            fVar19 <= (float)(~uVar8 & (uint)-fVar17 | (uint)fVar17 & uVar8))) || (2 < uVar7))
        goto LAB_0185fb58;
        uVar7 = uVar7 + 1;
      }
      dVar15 = 0.0;
      dVar16 = 1.0;
LAB_0185fb58:
      iVar1 = iVar4 * (int)uVar5;
      *(double *)(pcVar2 + (long)iVar1 + (long)offset) = dVar10;
      *(double *)(pcVar2 + (long)(iVar1 + 8) + (long)offset) = dVar13;
      dVar11 = (dVar11 - dVar12) + dVar10;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6) + (long)offset) = dVar11;
      *(double *)(pcVar2 + (long)(iVar1 + 8 + iVar6) + (long)offset) = dVar13;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 2) + (long)offset) = dVar10;
      dVar12 = (__x - dVar14) + dVar13;
      *(double *)(pcVar2 + (long)(iVar1 + 8 + iVar6 * 2) + (long)offset) = dVar12;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 3) + (long)offset) = dVar10;
      *(double *)(pcVar2 + (long)(iVar1 + 8 + iVar6 * 3) + (long)offset) = dVar12;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 4) + (long)offset) = dVar11;
      *(double *)(pcVar2 + (long)(iVar1 + 8 + iVar6 * 4) + (long)offset) = dVar13;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 5) + (long)offset) = dVar11;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 5 + 8) + (long)offset) = dVar12;
      if (2 < componentCount) {
        lVar3 = 6;
        iVar1 = local_dc;
        do {
          *(double *)(pcVar2 + (long)iVar1 + (long)offset) = dVar15;
          iVar1 = iVar1 + iVar6;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
        if (componentCount != 3) {
          lVar3 = 6;
          iVar1 = local_e0;
          do {
            *(double *)(pcVar2 + (long)iVar1 + (long)offset) = dVar16;
            iVar1 = iVar1 + iVar6;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
      }
      uVar5 = uVar5 + 1;
      local_dc = local_dc + iVar4;
      local_e0 = local_e0 + iVar4;
    } while (uVar5 != (uint)count);
  }
  return pcVar2;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}